

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool.c
# Opt level: O3

binding_t * add_binding_to_tool(tool_t *tool,gotcha_binding_t *user_binding,int user_binding_size)

{
  int iVar1;
  binding_t *__ptr;
  internal_binding_t *data;
  ulong uVar2;
  gotcha_binding_t *pgVar3;
  internal_binding_t *piVar4;
  
  __ptr = (binding_t *)malloc(0x58);
  __ptr->tool = tool;
  data = (internal_binding_t *)malloc((long)user_binding_size << 5);
  if (0 < user_binding_size) {
    uVar2 = (ulong)(uint)user_binding_size;
    pgVar3 = user_binding;
    piVar4 = data;
    do {
      piVar4->user_binding = pgVar3;
      *pgVar3->function_handle = piVar4;
      piVar4->associated_binding_table = __ptr;
      piVar4 = piVar4 + 1;
      pgVar3 = pgVar3 + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  __ptr->internal_bindings = data;
  __ptr->internal_bindings_size = user_binding_size;
  iVar1 = create_hashtable(&__ptr->binding_hash,(long)(user_binding_size * 2),strhash,strcmp);
  if (iVar1 == 0) {
    if (0 < user_binding_size) {
      uVar2 = (ulong)(uint)user_binding_size;
      do {
        iVar1 = addto_hashtable(&__ptr->binding_hash,user_binding->name,data);
        if (iVar1 != 0) {
          if (debug_level != 0) {
            add_binding_to_tool_cold_2();
          }
          goto LAB_00105293;
        }
        data = data + 1;
        user_binding = user_binding + 1;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    __ptr->next_tool_binding = tool->binding;
    tool->binding = __ptr;
    __ptr->next_binding = all_bindings;
    all_bindings = __ptr;
    if (1 < debug_level) {
      add_binding_to_tool_cold_3();
    }
  }
  else {
    if (debug_level != 0) {
      add_binding_to_tool_cold_1();
    }
LAB_00105293:
    free(__ptr);
    __ptr = (binding_t *)0x0;
  }
  return __ptr;
}

Assistant:

binding_t *add_binding_to_tool(tool_t *tool, struct gotcha_binding_t *user_binding, int user_binding_size)
{
   binding_t *newbinding;
   int result, i;
   newbinding = (binding_t *) gotcha_malloc(sizeof(binding_t));
   newbinding->tool = tool;
   struct internal_binding_t* internal_bindings = (struct internal_binding_t*)gotcha_malloc(sizeof(struct internal_binding_t)*user_binding_size);
   for(i=0;i<user_binding_size;i++){
      internal_bindings[i].user_binding = &user_binding[i];
      *(user_binding[i].function_handle) = &internal_bindings[i];
      internal_bindings[i].associated_binding_table = newbinding;
   }  
   newbinding->internal_bindings = internal_bindings;
   newbinding->internal_bindings_size = user_binding_size;
   result = create_hashtable(&newbinding->binding_hash, user_binding_size * 2, 
                             (hash_func_t) strhash, (hash_cmp_t) gotcha_strcmp);
   if (result != 0) {
      error_printf("Could not create hash table for %s\n", tool->tool_name);
      goto error; // error is a label which frees allocated resources and returns NULL
   }

   for (i = 0; i < user_binding_size; i++) {
      result = addto_hashtable(&newbinding->binding_hash, (void *) user_binding[i].name,
                               (void *) (internal_bindings + i));
      if (result != 0) {
         error_printf("Could not add hash entry for %s to table for tool %s\n", 
                      user_binding[i].name, tool->tool_name);
         goto error; // error is a label which frees allocated resources and returns NULL
      }
   }

   newbinding->next_tool_binding = tool->binding;
   tool->binding = newbinding;

   newbinding->next_binding = all_bindings;
   all_bindings = newbinding;

   debug_printf(2, "Created new binding table of size %d for tool %s\n", user_binding_size, tool->tool_name);
   return newbinding;

  error:
   if (newbinding)
      gotcha_free(newbinding);
   return NULL;
}